

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode pop3_connect(connectdata *conn,_Bool *done)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  CURLcode CVar5;
  CURLcode CVar6;
  bool bVar7;
  size_t max;
  char *first;
  char *first_00;
  
  *done = false;
  (conn->bits).close = false;
  (conn->proto).ftpc.pp.response_time = (long)"gIcSt11char_traitsIcESaIcEEE";
  (conn->proto).ftpc.pp.statemach_act = pop3_statemach_act;
  (conn->proto).ftpc.pp.endofresp = pop3_endofresp;
  (conn->proto).ftpc.pp.conn = conn;
  *(undefined8 *)((long)&conn->proto + 0x90) = 0xffffffffffffffff;
  Curl_pp_init(&(conn->proto).ftpc.pp);
  first_00 = conn->options;
  bVar7 = true;
  CVar5 = CURLE_OK;
  do {
    do {
      CVar6 = CVar5;
      if ((first_00 == (char *)0x0) || (cVar2 = *first_00, pcVar1 = first_00, cVar2 == '\0')) {
        if (CVar6 == CURLE_OK) {
          (conn->proto).imapc.state = IMAP_SERVERGREET;
          CVar5 = pop3_multi_statemach(conn,done);
          return CVar5;
        }
        return CVar6;
      }
      while ((first = pcVar1 + 1, cVar2 != '\0' && (cVar2 != '='))) {
        pcVar1 = first;
        cVar2 = *first;
      }
      iVar3 = curl_strnequal(first_00,"AUTH",4);
      first_00 = pcVar1;
      CVar5 = CURLE_URL_MALFORMAT;
    } while (iVar3 == 0);
    if (bVar7) {
      *(undefined8 *)((long)&conn->proto + 0x90) = 0;
    }
    for (max = 0; (first[max] != '\0' && (first[max] != ';')); max = max + 1) {
    }
    iVar3 = curl_strnequal(first,"*",max);
    if (iVar3 == 0) {
      iVar3 = curl_strnequal(first,"+APOP",max);
      if (iVar3 != 0) {
        (conn->proto).pop3c.preftype = 2;
        uVar4 = 0;
        goto LAB_00440aeb;
      }
      iVar3 = curl_strnequal(first,"LOGIN",max);
      if (iVar3 != 0) {
        (conn->proto).pop3c.preftype = 4;
        uVar4 = (conn->proto).pop3c.prefmech | 1;
        goto LAB_00440aeb;
      }
      iVar3 = curl_strnequal(first,"PLAIN",max);
      if (iVar3 != 0) {
        (conn->proto).pop3c.preftype = 4;
        uVar4 = (conn->proto).pop3c.prefmech | 2;
        goto LAB_00440aeb;
      }
      iVar3 = curl_strnequal(first,"CRAM-MD5",max);
      if (iVar3 != 0) {
        (conn->proto).pop3c.preftype = 4;
        uVar4 = (conn->proto).pop3c.prefmech | 4;
        goto LAB_00440aeb;
      }
      iVar3 = curl_strnequal(first,"DIGEST-MD5",max);
      if (iVar3 != 0) {
        (conn->proto).pop3c.preftype = 4;
        uVar4 = (conn->proto).pop3c.prefmech | 8;
        goto LAB_00440aeb;
      }
      iVar3 = curl_strnequal(first,"GSSAPI",max);
      if (iVar3 != 0) {
        (conn->proto).pop3c.preftype = 4;
        uVar4 = (conn->proto).pop3c.prefmech | 0x10;
        goto LAB_00440aeb;
      }
      iVar3 = curl_strnequal(first,"NTLM",max);
      if (iVar3 != 0) {
        (conn->proto).pop3c.preftype = 4;
        uVar4 = (conn->proto).pop3c.prefmech | 0x40;
        goto LAB_00440aeb;
      }
      iVar3 = curl_strnequal(first,"XOAUTH2",max);
      if (iVar3 != 0) {
        (conn->proto).pop3c.preftype = 4;
        uVar4 = (conn->proto).pop3c.prefmech | 0x80;
        goto LAB_00440aeb;
      }
    }
    else {
      (conn->proto).pop3c.preftype = 0xffffffff;
      uVar4 = 0xffffffff;
LAB_00440aeb:
      (conn->proto).pop3c.prefmech = uVar4;
    }
    first_00 = first + (first[max] == ';') + max;
    bVar7 = false;
    CVar5 = CVar6;
  } while( true );
}

Assistant:

static CURLcode pop3_connect(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections in POP3 */
  connkeep(conn, "POP3 default");

  /* Set the default response time-out */
  pp->response_time = RESP_TIMEOUT;
  pp->statemach_act = pop3_statemach_act;
  pp->endofresp = pop3_endofresp;
  pp->conn = conn;

  /* Set the default preferred authentication type and mechanism */
  pop3c->preftype = POP3_TYPE_ANY;
  pop3c->prefmech = SASL_AUTH_ANY;

  /* Initialise the pingpong layer */
  Curl_pp_init(pp);

  /* Parse the URL options */
  result = pop3_parse_url_options(conn);
  if(result)
    return result;

  /* Start off waiting for the server greeting response */
  state(conn, POP3_SERVERGREET);

  result = pop3_multi_statemach(conn, done);

  return result;
}